

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::GeneratedCodeInfo::MergeFrom(GeneratedCodeInfo *this,Message *from)

{
  GeneratedCodeInfo *from_00;
  
  from_00 = (GeneratedCodeInfo *)__dynamic_cast(from,&Message::typeinfo,&typeinfo,0);
  if (from_00 != (GeneratedCodeInfo *)0x0) {
    MergeFrom(this,from_00);
    return;
  }
  internal::ReflectionOps::Merge(from,&this->super_Message);
  return;
}

Assistant:

void GeneratedCodeInfo::MergeFrom(const ::PROTOBUF_NAMESPACE_ID::Message& from) {
// @@protoc_insertion_point(generalized_merge_from_start:google.protobuf.GeneratedCodeInfo)
  GOOGLE_DCHECK_NE(&from, this);
  const GeneratedCodeInfo* source =
      ::PROTOBUF_NAMESPACE_ID::DynamicCastToGenerated<GeneratedCodeInfo>(
          &from);
  if (source == nullptr) {
  // @@protoc_insertion_point(generalized_merge_from_cast_fail:google.protobuf.GeneratedCodeInfo)
    ::PROTOBUF_NAMESPACE_ID::internal::ReflectionOps::Merge(from, this);
  } else {
  // @@protoc_insertion_point(generalized_merge_from_cast_success:google.protobuf.GeneratedCodeInfo)
    MergeFrom(*source);
  }
}